

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O1

NodePtr __thiscall dh::analysis::unary_expr(analysis *this)

{
  pointer pcVar1;
  element_type *peVar2;
  bool bVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  analysis *in_RSI;
  TreeNode *__tmp;
  bool bVar10;
  NodePtr NVar11;
  NodePtr tmp_in_ptr;
  NodePtr tmp_cur_ptr;
  NodePtr tmp_ptr;
  string tmp_str;
  undefined1 local_179;
  undefined1 local_178 [48];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  TreeNode *local_140;
  const_iterator local_138;
  int local_12c;
  NodePtr local_128;
  undefined1 local_118 [40];
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  undefined1 local_c0 [16];
  string local_b0;
  string local_90;
  string local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  
  this->layer_record = 0;
  this->initFlag = false;
  *(undefined3 *)&this->field_0x5 = 0;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = 0;
  local_40[0] = 0;
  local_50 = local_40;
  token::getVal_abi_cxx11_
            ((string *)local_178,
             (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  iVar7 = std::__cxx11::string::compare(local_178);
  bVar10 = true;
  if (iVar7 != 0) {
    token::getVal_abi_cxx11_
              (&local_90,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    iVar8 = std::__cxx11::string::compare((char *)&local_90);
    if (iVar8 != 0) {
      token::getVal_abi_cxx11_
                (&local_70,
                 (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      iVar8 = std::__cxx11::string::compare((char *)&local_70);
      bVar10 = iVar8 == 0;
      bVar3 = true;
      goto LAB_00116e6b;
    }
  }
  bVar3 = false;
LAB_00116e6b:
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2)) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((iVar7 != 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2)) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  pcVar1 = local_178 + 0x10;
  if ((pointer)local_178._0_8_ != pcVar1) {
    operator_delete((void *)local_178._0_8_);
  }
  if (bVar10) {
    token::getVal_abi_cxx11_
              ((string *)local_178,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    local_d0._M_allocated_capacity._0_4_ =
         token::getLineno((in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr);
    local_118._0_8_ = (TreeNode *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_118 + 8),(TreeNode **)local_118,
               (allocator<dh::TreeNode> *)&local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_178,
               (int *)local_d0._M_local_buf);
    uVar6 = local_118._8_8_;
    uVar4 = local_118._0_8_;
    local_118._0_8_ = (element_type *)0x0;
    uVar5 = local_118._0_8_;
    local_118._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_118._0_4_ = (undefined4)uVar4;
    local_118[4] = SUB81(uVar4,4);
    local_118._5_3_ = SUB83(uVar4,5);
    this->layer_record = local_118._0_4_;
    this->initFlag = (bool)local_118[4];
    *(undefined3 *)&this->field_0x5 = local_118._5_3_;
    peVar2 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)uVar6;
    local_118._0_8_ = uVar5;
    if (peVar2 != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
    }
    if ((pointer)local_178._0_8_ != pcVar1) {
      operator_delete((void *)local_178._0_8_);
    }
    local_178._0_4_ = 1;
    TreeNode::setNodeKind((TreeNode *)uVar4,(int *)local_178);
    local_178._0_4_ = 7;
    TreeNode::setKind((TreeNode *)uVar4,(int *)local_178);
    token::getVal_abi_cxx11_
              (&local_b0,
               (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    match(in_RSI,&local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p);
    }
    local_140 = (TreeNode *)uVar4;
    local_138._M_current = (token *)uVar6;
    if ((element_type *)uVar6 != (element_type *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&(((shared_ptr<dh::symTab> *)(uVar6 + 8))->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)(uVar6 + 8))->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
        UNLOCK();
      }
      else {
        *(int *)&(((shared_ptr<dh::symTab> *)(uVar6 + 8))->
                 super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
             *(int *)&(((shared_ptr<dh::symTab> *)(uVar6 + 8))->
                      super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + 1;
      }
    }
    do {
      while( true ) {
        token::getVal_abi_cxx11_
                  ((string *)local_178,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        iVar7 = std::__cxx11::string::compare((char *)local_178);
        bVar10 = true;
        if (iVar7 == 0) {
          bVar3 = false;
        }
        else {
          local_178._36_4_ = iVar7;
          token::getVal_abi_cxx11_
                    ((string *)local_118,
                     (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
          ;
          iVar7 = std::__cxx11::string::compare((char *)local_118);
          if (iVar7 == 0) {
            bVar10 = true;
          }
          else {
            token::getVal_abi_cxx11_
                      ((string *)&local_d0,
                       (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
            iVar8 = std::__cxx11::string::compare(local_d0._M_local_buf);
            bVar10 = iVar8 == 0;
          }
          bVar3 = iVar7 != 0;
          iVar7 = local_178._36_4_;
        }
        if ((bVar3) &&
           ((undefined1 *)
            CONCAT44(local_d0._M_allocated_capacity._4_4_,local_d0._M_allocated_capacity._0_4_) !=
            local_c0)) {
          operator_delete((undefined1 *)
                          CONCAT44(local_d0._M_allocated_capacity._4_4_,
                                   local_d0._M_allocated_capacity._0_4_));
        }
        if ((iVar7 != 0) && ((element_type *)local_118._0_8_ != (element_type *)(local_118 + 0x10)))
        {
          operator_delete((void *)local_118._0_8_);
        }
        if ((pointer)local_178._0_8_ != pcVar1) {
          operator_delete((void *)local_178._0_8_);
        }
        if (!bVar10) break;
        token::getVal_abi_cxx11_
                  ((string *)local_178,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_12c = token::getLineno((in_RSI->tmp).
                                     super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>.
                                     _M_ptr);
        local_178._40_8_ = (TreeNode *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<dh::TreeNode,std::allocator<dh::TreeNode>,std::__cxx11::string,int>
                  (&local_148,(TreeNode **)(local_178 + 0x28),(allocator<dh::TreeNode> *)&local_179,
                   (string *)local_178,&local_12c);
        if ((pointer)local_178._0_8_ != pcVar1) {
          operator_delete((void *)local_178._0_8_);
        }
        local_178._0_4_ = 1;
        TreeNode::setNodeKind((TreeNode *)local_178._40_8_,(int *)local_178);
        local_178._0_4_ = 7;
        TreeNode::setKind((TreeNode *)local_178._40_8_,(int *)local_178);
        token::getVal_abi_cxx11_
                  ((string *)local_f0,
                   (in_RSI->tmp).super___shared_ptr<dh::token,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        match(in_RSI,(string *)local_f0);
        if ((pointer)local_f0._0_8_ != (pointer)(local_f0 + 0x10)) {
          operator_delete((void *)local_f0._0_8_);
        }
        TreeNode::appendChild(local_140,(NodePtr *)(local_178 + 0x28));
        local_140 = (TreeNode *)local_178._40_8_;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_138,&local_148);
        if ((pointer)local_148._M_pi != (pointer)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148._M_pi);
        }
      }
      primary_expr((analysis *)local_178);
      _Var9._M_pi = local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_;
      local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_178._0_8_;
      local_178._0_8_ = (pointer)0x0;
      local_178._8_8_ = (element_type *)0x0;
      if ((element_type *)_Var9._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
      if ((element_type *)local_178._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
      }
      TreeNode::appendChild(local_140,&local_128);
    } while( true );
  }
  NVar11 = primary_expr((analysis *)local_178);
  uVar6 = local_178._8_8_;
  uVar4 = local_178._0_8_;
  _Var9 = NVar11.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_178._0_8_ = (pointer)0x0;
  uVar5 = local_178._0_8_;
  local_178._8_8_ = (element_type *)0x0;
  peVar2 = (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_178._0_4_ = (undefined4)uVar4;
  local_178[4] = SUB81(uVar4,4);
  local_178._5_3_ = SUB83(uVar4,5);
  this->layer_record = local_178._0_4_;
  this->initFlag = (bool)local_178[4];
  *(undefined3 *)&this->field_0x5 = local_178._5_3_;
  (this->current_tab).super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar6;
  local_178._0_8_ = uVar5;
  if (peVar2 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar2);
    _Var9._M_pi = extraout_RDX;
  }
  if ((element_type *)local_178._8_8_ != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._8_8_);
    _Var9._M_pi = extraout_RDX_00;
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
    _Var9._M_pi = extraout_RDX_01;
  }
  if ((element_type *)
      local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_128.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var9._M_pi = extraout_RDX_02;
  }
  NVar11.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  NVar11.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (NodePtr)NVar11.super___shared_ptr<dh::TreeNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

NodePtr analysis::unary_expr()
{
#ifdef _DEBUG_
	::std::cout << "[DEBUG] in unary_expr\n";
#endif
	NodePtr ret;
	NodePtr tmp_ptr;
	::std::string tmp_str;

	if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
	{
		ret = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
		ret->setNodeKind(NodeKind::ExprK);
		ret->setKind(ExprKind::UnaryK);

		match(tmp->getVal());
	} else 
	{
		ret = primary_expr();
		return ret;
	}

	NodePtr tmp_cur_ptr = ret;
	while(1)
	{
		if ( tmp->getVal() == "+"
			|| tmp->getVal() == "-"
			|| tmp->getVal() == "!")
		{
			NodePtr tmp_in_ptr = ::std::make_shared<TreeNode>(tmp->getVal(),tmp->getLineno());
			tmp_in_ptr->setNodeKind(NodeKind::ExprK);
			tmp_in_ptr->setKind(ExprKind::UnaryK);

			match(tmp->getVal());
			tmp_cur_ptr->appendChild(tmp_in_ptr);
			tmp_cur_ptr = tmp_in_ptr;
		} else 
		{
			tmp_ptr = primary_expr();
			tmp_cur_ptr->appendChild(tmp_ptr);
		}
	}

	return ret;
}